

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O1

void __thiscall slang::ast::builtins::Builtins::registerArrayMethods(Builtins *this)

{
  SymbolKind SVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  Operator op;
  Operator op_00;
  Operator op_01;
  Operator op_02;
  Operator op_03;
  bool local_2d9;
  ArrayLocatorMethod *local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_2d0 [2];
  Mode local_2bc;
  vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> local_2b8;
  uint local_294;
  SymbolKind local_290 [3];
  bool local_281;
  VoidType *local_280;
  shared_ptr<slang::ast::SystemSubroutine> local_278;
  shared_ptr<slang::ast::SystemSubroutine> local_268;
  shared_ptr<slang::ast::SystemSubroutine> local_258;
  shared_ptr<slang::ast::SystemSubroutine> local_248;
  shared_ptr<slang::ast::SystemSubroutine> local_238;
  shared_ptr<slang::ast::SystemSubroutine> local_228;
  shared_ptr<slang::ast::SystemSubroutine> local_218;
  shared_ptr<slang::ast::SystemSubroutine> local_208;
  shared_ptr<slang::ast::SystemSubroutine> local_1f8;
  shared_ptr<slang::ast::SystemSubroutine> local_1e8;
  shared_ptr<slang::ast::SystemSubroutine> local_1d8;
  shared_ptr<slang::ast::SystemSubroutine> local_1c8;
  shared_ptr<slang::ast::SystemSubroutine> local_1b8;
  shared_ptr<slang::ast::SystemSubroutine> local_1a8;
  shared_ptr<slang::ast::SystemSubroutine> local_198;
  shared_ptr<slang::ast::SystemSubroutine> local_188;
  shared_ptr<slang::ast::SystemSubroutine> local_178;
  shared_ptr<slang::ast::SystemSubroutine> local_168;
  shared_ptr<slang::ast::SystemSubroutine> local_158;
  shared_ptr<slang::ast::SystemSubroutine> local_148;
  shared_ptr<slang::ast::SystemSubroutine> local_138;
  shared_ptr<slang::ast::SystemSubroutine> local_128;
  shared_ptr<slang::ast::SystemSubroutine> local_118;
  shared_ptr<slang::ast::SystemSubroutine> local_108;
  shared_ptr<slang::ast::SystemSubroutine> local_f8;
  shared_ptr<slang::ast::SystemSubroutine> local_e8;
  shared_ptr<slang::ast::SystemSubroutine> local_d8;
  shared_ptr<slang::ast::SystemSubroutine> local_c8;
  shared_ptr<slang::ast::SystemSubroutine> local_b8;
  shared_ptr<slang::ast::SystemSubroutine> local_a8;
  shared_ptr<slang::ast::SystemSubroutine> local_98;
  shared_ptr<slang::ast::SystemSubroutine> local_88;
  shared_ptr<slang::ast::SystemSubroutine> local_78;
  shared_ptr<slang::ast::SystemSubroutine> local_68;
  shared_ptr<slang::ast::SystemSubroutine> local_58;
  shared_ptr<slang::ast::SystemSubroutine> local_48;
  
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0xe0000000d;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x1100000010;
  lVar3 = 0;
  do {
    local_280 = (VoidType *)lVar3;
    SVar1 = *(SymbolKind *)
             ((long)&local_2b8.
                     super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                     ._M_impl.super__Vector_impl_data._M_start + lVar3);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c5128;
    op.callable = (intptr_t)&local_2d8;
    op.callback = function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
                  callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__0>;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)(p_Var2 + 1),Or,op);
    local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    addSystemMethod(this,SVar1,&local_238);
    if (local_238.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_238.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c5128;
    op_00.callable = (intptr_t)&local_2d8;
    op_00.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__1>;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)(p_Var2 + 1),And,op_00);
    local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    addSystemMethod(this,SVar1,&local_248);
    if (local_248.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_248.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c5128;
    op_01.callable = (intptr_t)&local_2d8;
    op_01.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__2>;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)(p_Var2 + 1),XOr,op_01);
    local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    addSystemMethod(this,SVar1,&local_258);
    if (local_258.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_258.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c5128;
    op_02.callable = (intptr_t)&local_2d8;
    op_02.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__3>;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)(p_Var2 + 1),Sum,op_02);
    local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    addSystemMethod(this,SVar1,&local_268);
    if (local_268.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_268.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var2->_M_use_count = 1;
    p_Var2->_M_weak_count = 1;
    p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c5128;
    op_03.callable = (intptr_t)&local_2d8;
    op_03.callback =
         function_ref<void(slang::SVInt&,slang::SVInt_const&)>::
         callback_fn<slang::ast::builtins::Builtins::registerArrayMethods()::__4>;
    ArrayReductionMethod::ArrayReductionMethod((ArrayReductionMethod *)(p_Var2 + 1),Product,op_03);
    local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var2 + 1);
    local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var2;
    addSystemMethod(this,SVar1,&local_278);
    if (local_278.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_278.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_290[0] = 0xf3;
    local_2bc = All;
    local_2d9 = false;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayLocatorMethod,std::allocator<slang::ast::builtins::ArrayLocatorMethod>,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (a_Stack_2d0,&local_2d8,
               (allocator<slang::ast::builtins::ArrayLocatorMethod> *)&local_294,
               (KnownSystemName *)local_290,&local_2bc,&local_2d9);
    local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_138);
    if (local_138.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_138.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xf4;
    local_2bc = All;
    local_2d9 = true;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayLocatorMethod,std::allocator<slang::ast::builtins::ArrayLocatorMethod>,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (a_Stack_2d0,&local_2d8,
               (allocator<slang::ast::builtins::ArrayLocatorMethod> *)&local_294,
               (KnownSystemName *)local_290,&local_2bc,&local_2d9);
    local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_148);
    if (local_148.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_148.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xf5;
    local_2bc = First;
    local_2d9 = false;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayLocatorMethod,std::allocator<slang::ast::builtins::ArrayLocatorMethod>,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (a_Stack_2d0,&local_2d8,
               (allocator<slang::ast::builtins::ArrayLocatorMethod> *)&local_294,
               (KnownSystemName *)local_290,&local_2bc,&local_2d9);
    local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_158);
    if (local_158.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_158.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xf6;
    local_2bc = First;
    local_2d9 = true;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayLocatorMethod,std::allocator<slang::ast::builtins::ArrayLocatorMethod>,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (a_Stack_2d0,&local_2d8,
               (allocator<slang::ast::builtins::ArrayLocatorMethod> *)&local_294,
               (KnownSystemName *)local_290,&local_2bc,&local_2d9);
    local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_168);
    if (local_168.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_168.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xf7;
    local_2bc = Last;
    local_2d9 = false;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayLocatorMethod,std::allocator<slang::ast::builtins::ArrayLocatorMethod>,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (a_Stack_2d0,&local_2d8,
               (allocator<slang::ast::builtins::ArrayLocatorMethod> *)&local_294,
               (KnownSystemName *)local_290,&local_2bc,&local_2d9);
    local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_178);
    if (local_178.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_178.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xf8;
    local_2bc = Last;
    local_2d9 = true;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayLocatorMethod,std::allocator<slang::ast::builtins::ArrayLocatorMethod>,slang::parsing::KnownSystemName,slang::ast::builtins::ArrayLocatorMethod::Mode,bool>
              (a_Stack_2d0,&local_2d8,
               (allocator<slang::ast::builtins::ArrayLocatorMethod> *)&local_294,
               (KnownSystemName *)local_290,&local_2bc,&local_2d9);
    local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_188);
    if (local_188.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_188.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xf9;
    local_294 = CONCAT31(local_294._1_3_,1);
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayMinMaxMethod,std::allocator<slang::ast::builtins::ArrayMinMaxMethod>,slang::parsing::KnownSystemName,bool>
              (a_Stack_2d0,(ArrayMinMaxMethod **)&local_2d8,
               (allocator<slang::ast::builtins::ArrayMinMaxMethod> *)&local_2bc,
               (KnownSystemName *)local_290,(bool *)&local_294);
    local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_198);
    if (local_198.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xfa;
    local_294 = local_294 & 0xffffff00;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayMinMaxMethod,std::allocator<slang::ast::builtins::ArrayMinMaxMethod>,slang::parsing::KnownSystemName,bool>
              (a_Stack_2d0,(ArrayMinMaxMethod **)&local_2d8,
               (allocator<slang::ast::builtins::ArrayMinMaxMethod> *)&local_2bc,
               (KnownSystemName *)local_290,(bool *)&local_294);
    local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_1a8);
    if (local_1a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1a8.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xfb;
    local_294 = local_294 & 0xffffff00;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayUniqueMethod,std::allocator<slang::ast::builtins::ArrayUniqueMethod>,slang::parsing::KnownSystemName,bool>
              (a_Stack_2d0,(ArrayUniqueMethod **)&local_2d8,
               (_Sp_alloc_shared_tag<std::allocator<slang::ast::builtins::ArrayUniqueMethod>_>)
               &local_2bc,(KnownSystemName *)local_290,(bool *)&local_294);
    local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_1b8);
    if (local_1b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_290[0] = 0xfc;
    local_294 = CONCAT31(local_294._1_3_,1);
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayUniqueMethod,std::allocator<slang::ast::builtins::ArrayUniqueMethod>,slang::parsing::KnownSystemName,bool>
              (a_Stack_2d0,(ArrayUniqueMethod **)&local_2d8,
               (_Sp_alloc_shared_tag<std::allocator<slang::ast::builtins::ArrayUniqueMethod>_>)
               &local_2bc,(KnownSystemName *)local_290,(bool *)&local_294);
    local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_1c8);
    if (local_1c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1c8.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayMapMethod,std::allocator<slang::ast::builtins::ArrayMapMethod>>
              (a_Stack_2d0,(ArrayMapMethod **)&local_2d8,
               (allocator<slang::ast::builtins::ArrayMapMethod> *)local_290);
    local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_1d8);
    if (local_1d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1d8.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    lVar3 = (long)local_280 + 4;
  } while (lVar3 != 0x10);
  local_2d8 = (ArrayLocatorMethod *)0x100000000e;
  a_Stack_2d0[0]._M_pi._0_4_ = 0x11;
  lVar3 = 0;
  do {
    SVar1 = *(SymbolKind *)((long)&a_Stack_2d0[-1]._M_pi + lVar3);
    local_290[0] = 0xed;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArraySizeMethod,std::allocator<slang::ast::builtins::ArraySizeMethod>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2b8.
                super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,(ArraySizeMethod **)&local_2b8,
               (allocator<slang::ast::builtins::ArraySizeMethod> *)&local_2bc,this,local_290);
    local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1e8);
    if (local_1e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1e8.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2b8.
        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2b8.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  local_290[0] = FixedSizeUnpackedArrayType;
  local_290[1] = DynamicArrayType;
  local_290[2] = 0x11;
  local_280 = &this->voidType;
  lVar3 = 0;
  do {
    SVar1 = *(SymbolKind *)((long)local_290 + lVar3);
    local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0xfd);
    local_294 = local_294 & 0xffffff00;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArraySortMethod,std::allocator<slang::ast::builtins::ArraySortMethod>,slang::parsing::KnownSystemName,bool>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2b8.
                super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,(ArraySortMethod **)&local_2b8,
               (allocator<slang::ast::builtins::ArraySortMethod> *)&local_2bc,
               (KnownSystemName *)&local_2d8,(bool *)&local_294);
    local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_1f8);
    if (local_1f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1f8.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2b8.
        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2b8.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0xfe);
    local_294 = CONCAT31(local_294._1_3_,1);
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArraySortMethod,std::allocator<slang::ast::builtins::ArraySortMethod>,slang::parsing::KnownSystemName,bool>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2b8.
                super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,(ArraySortMethod **)&local_2b8,
               (allocator<slang::ast::builtins::ArraySortMethod> *)&local_2bc,
               (KnownSystemName *)&local_2d8,(bool *)&local_294);
    local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_208);
    if (local_208.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2b8.
        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2b8.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::builtins::ArrayReverseMethod,std::allocator<slang::ast::builtins::ArrayReverseMethod>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_2b8.
                super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_finish,(ArrayReverseMethod **)&local_2b8,
               (allocator<slang::ast::builtins::ArrayReverseMethod> *)&local_2d8);
    local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         local_2b8.
         super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    addSystemMethod(this,SVar1,&local_218);
    if (local_218.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_218.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_2b8.
        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_2b8.
                 super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_2bc = 0xff;
    local_294 = 0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_281 = true;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<slang::ast::NonConstantFunction,std::allocator<slang::ast::NonConstantFunction>,slang::parsing::KnownSystemName,slang::ast::VoidType&,int,std::vector<slang::ast::Type_const*,std::allocator<slang::ast::Type_const*>>,bool>
              (a_Stack_2d0,(NonConstantFunction **)&local_2d8,
               (allocator<slang::ast::NonConstantFunction> *)&local_2d9,&local_2bc,local_280,
               (int *)&local_294,&local_2b8,&local_281);
    local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_2d8->super_SystemSubroutine;
    local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = a_Stack_2d0[0]._M_pi;
    local_2d8 = (ArrayLocatorMethod *)0x0;
    a_Stack_2d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    addSystemMethod(this,SVar1,&local_228);
    if (local_228.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.
                 super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (a_Stack_2d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_2d0[0]._M_pi);
    }
    if (local_2b8.
        super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2b8.
                      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_2b8.
                            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.
                            super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x100);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::ArraySizeMethod,std::allocator<slang::ast::builtins::ArraySizeMethod>,slang::ast::builtins::Builtins&,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(ArraySizeMethod **)&local_2b8,
             (allocator<slang::ast::builtins::ArraySizeMethod> *)local_290,this,
             (KnownSystemName *)&local_2d8);
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_48);
  if (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::DynArrayDeleteMethod,std::allocator<slang::ast::builtins::DynArrayDeleteMethod>,slang::ast::builtins::Builtins&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(DynArrayDeleteMethod **)&local_2b8,
             (allocator<slang::ast::builtins::DynArrayDeleteMethod> *)&local_2d8,this);
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,DynamicArrayType,&local_58);
  if (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssocArrayDeleteMethod,std::allocator<slang::ast::builtins::AssocArrayDeleteMethod>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssocArrayDeleteMethod **)&local_2b8,
             (allocator<slang::ast::builtins::AssocArrayDeleteMethod> *)&local_2d8);
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_68);
  if (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::QueueDeleteMethod,std::allocator<slang::ast::builtins::QueueDeleteMethod>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(QueueDeleteMethod **)&local_2b8,
             (allocator<slang::ast::builtins::QueueDeleteMethod> *)&local_2d8);
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_78);
  if (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssocArrayExistsMethod,std::allocator<slang::ast::builtins::AssocArrayExistsMethod>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssocArrayExistsMethod **)&local_2b8,
             (allocator<slang::ast::builtins::AssocArrayExistsMethod> *)&local_2d8);
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_88);
  if (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_88.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x101);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssocArrayTraversalMethod,std::allocator<slang::ast::builtins::AssocArrayTraversalMethod>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssocArrayTraversalMethod **)&local_2b8,
             (allocator<slang::ast::builtins::AssocArrayTraversalMethod> *)local_290,
             (KnownSystemName *)&local_2d8);
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_98);
  if (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x102);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssocArrayTraversalMethod,std::allocator<slang::ast::builtins::AssocArrayTraversalMethod>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssocArrayTraversalMethod **)&local_2b8,
             (allocator<slang::ast::builtins::AssocArrayTraversalMethod> *)local_290,
             (KnownSystemName *)&local_2d8);
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_a8);
  if (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x103);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssocArrayTraversalMethod,std::allocator<slang::ast::builtins::AssocArrayTraversalMethod>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssocArrayTraversalMethod **)&local_2b8,
             (allocator<slang::ast::builtins::AssocArrayTraversalMethod> *)local_290,
             (KnownSystemName *)&local_2d8);
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_b8);
  if (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x104);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::AssocArrayTraversalMethod,std::allocator<slang::ast::builtins::AssocArrayTraversalMethod>,slang::parsing::KnownSystemName>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(AssocArrayTraversalMethod **)&local_2b8,
             (allocator<slang::ast::builtins::AssocArrayTraversalMethod> *)local_290,
             (KnownSystemName *)&local_2d8);
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,AssociativeArrayType,&local_c8);
  if (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x105);
  local_2bc = CONCAT31(local_2bc._1_3_,1);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::QueuePopMethod,std::allocator<slang::ast::builtins::QueuePopMethod>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(QueuePopMethod **)&local_2b8,
             (allocator<slang::ast::builtins::QueuePopMethod> *)local_290,
             (KnownSystemName *)&local_2d8,(bool *)&local_2bc);
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_d8);
  if (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x106);
  local_2bc = local_2bc & 0xffffff00;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::QueuePopMethod,std::allocator<slang::ast::builtins::QueuePopMethod>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(QueuePopMethod **)&local_2b8,
             (allocator<slang::ast::builtins::QueuePopMethod> *)local_290,
             (KnownSystemName *)&local_2d8,(bool *)&local_2bc);
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_e8);
  if (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x107);
  local_2bc = CONCAT31(local_2bc._1_3_,1);
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::QueuePushMethod,std::allocator<slang::ast::builtins::QueuePushMethod>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(QueuePushMethod **)&local_2b8,
             (allocator<slang::ast::builtins::QueuePushMethod> *)local_290,
             (KnownSystemName *)&local_2d8,(bool *)&local_2bc);
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_2b8.
          super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_f8);
  if (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2d8 = (ArrayLocatorMethod *)CONCAT44(local_2d8._4_4_,0x108);
  local_2bc = local_2bc & 0xffffff00;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::QueuePushMethod,std::allocator<slang::ast::builtins::QueuePushMethod>,slang::parsing::KnownSystemName,bool>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(QueuePushMethod **)&local_2b8,
             (allocator<slang::ast::builtins::QueuePushMethod> *)local_290,
             (KnownSystemName *)&local_2d8,(bool *)&local_2bc);
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_2b8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_108);
  if (local_108.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_108.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::QueueInsertMethod,std::allocator<slang::ast::builtins::QueueInsertMethod>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(QueueInsertMethod **)&local_2b8,
             (allocator<slang::ast::builtins::QueueInsertMethod> *)&local_2d8);
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_2b8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,QueueType,&local_118);
  if (local_118.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<slang::ast::builtins::IteratorIndexMethod,std::allocator<slang::ast::builtins::IteratorIndexMethod>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_2b8.
              super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish,(IteratorIndexMethod **)&local_2b8,
             (allocator<slang::ast::builtins::IteratorIndexMethod> *)&local_2d8);
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_2b8.
       super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_2b8.
           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  addSystemMethod(this,Iterator,&local_128);
  if (local_128.super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.
               super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_2b8.
      super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_2b8.
               super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Builtins::registerArrayMethods() {
    using parsing::KnownSystemName;

#define REGISTER(kind, name, ...) addSystemMethod(kind, std::make_shared<name##Method>(__VA_ARGS__))

    for (auto kind : {SymbolKind::FixedSizeUnpackedArrayType, SymbolKind::DynamicArrayType,
                      SymbolKind::AssociativeArrayType, SymbolKind::QueueType}) {
        REGISTER(kind, ArrayReduction, KnownSystemName::Or, [](auto& l, auto& r) { l |= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::And, [](auto& l, auto& r) { l &= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::XOr, [](auto& l, auto& r) { l ^= r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::Sum, [](auto& l, auto& r) { l += r; });
        REGISTER(kind, ArrayReduction, KnownSystemName::Product, [](auto& l, auto& r) { l *= r; });

        REGISTER(kind, ArrayLocator, KnownSystemName::Find, ArrayLocatorMethod::All, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindIndex, ArrayLocatorMethod::All, true);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindFirst, ArrayLocatorMethod::First, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindFirstIndex, ArrayLocatorMethod::First,
                 true);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindLast, ArrayLocatorMethod::Last, false);
        REGISTER(kind, ArrayLocator, KnownSystemName::FindLastIndex, ArrayLocatorMethod::Last,
                 true);

        REGISTER(kind, ArrayMinMax, KnownSystemName::Min, true);
        REGISTER(kind, ArrayMinMax, KnownSystemName::Max, false);

        REGISTER(kind, ArrayUnique, KnownSystemName::Unique, false);
        REGISTER(kind, ArrayUnique, KnownSystemName::UniqueIndex, true);

        REGISTER(kind, ArrayMap, );
    }

    for (auto kind :
         {SymbolKind::DynamicArrayType, SymbolKind::AssociativeArrayType, SymbolKind::QueueType}) {
        REGISTER(kind, ArraySize, *this, KnownSystemName::ArraySize);
    }

    for (auto kind : {SymbolKind::FixedSizeUnpackedArrayType, SymbolKind::DynamicArrayType,
                      SymbolKind::QueueType}) {
        REGISTER(kind, ArraySort, KnownSystemName::Sort, false);
        REGISTER(kind, ArraySort, KnownSystemName::Rsort, true);
        REGISTER(kind, ArrayReverse, );

        addSystemMethod(kind,
                        std::make_shared<NonConstantFunction>(KnownSystemName::Shuffle, voidType, 0,
                                                              std::vector<const Type*>{}, true));
    }

    // Associative arrays also alias "size" to "num" for some reason.
    REGISTER(SymbolKind::AssociativeArrayType, ArraySize, *this, KnownSystemName::Num);

    // "delete" methods
    REGISTER(SymbolKind::DynamicArrayType, DynArrayDelete, *this);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayDelete, );
    REGISTER(SymbolKind::QueueType, QueueDelete, );

    // Associative array methods.
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayExists, );
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::First);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Last);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Next);
    REGISTER(SymbolKind::AssociativeArrayType, AssocArrayTraversal, KnownSystemName::Prev);

    // Queue methods
    REGISTER(SymbolKind::QueueType, QueuePop, KnownSystemName::PopFront, true);
    REGISTER(SymbolKind::QueueType, QueuePop, KnownSystemName::PopBack, false);
    REGISTER(SymbolKind::QueueType, QueuePush, KnownSystemName::PushFront, true);
    REGISTER(SymbolKind::QueueType, QueuePush, KnownSystemName::PushBack, false);
    REGISTER(SymbolKind::QueueType, QueueInsert, );

    // Iterator methods
    REGISTER(SymbolKind::Iterator, IteratorIndex, );
}